

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_Ofs16_Data16(VGMPlayer *this)

{
  UINT16 UVar1;
  UINT16 UVar2;
  CHIP_DEVICE *pCVar3;
  UINT16 value;
  UINT16 ofs;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar3 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        (UINT8)((int)(this->_fileData[(ulong)this->_filePos + 1] & 0x80) >> 7));
  if ((pCVar3 != (CHIP_DEVICE *)0x0) && (pCVar3->writeM16 != (DEVFUNC_WRITE_A16D16)0x0)) {
    UVar1 = ReadBE16(this->_fileData + (ulong)this->_filePos + 1);
    UVar2 = ReadBE16(this->_fileData + (ulong)this->_filePos + 3);
    (*pCVar3->writeM16)((pCVar3->base).defInf.dataPtr,UVar1 & 0x7fff,UVar2);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Ofs16_Data16(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeM16 == NULL)
		return;
	
	UINT16 ofs = ReadBE16(&fData[0x01]) & 0x7FFF;
	UINT16 value = ReadBE16(&fData[0x03]);
	cDev->writeM16(cDev->base.defInf.dataPtr, ofs, value);
	return;
}